

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderInsufficientEmittedVerticesTest::iterate
          (GeometryShaderInsufficientEmittedVerticesTest *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  ulong uVar7;
  GLuint *pGVar8;
  NotSupportedError *this_00;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  string *local_528;
  MessageBuilder local_420;
  uint local_2a0;
  uint local_29c;
  GLuint pixel;
  GLuint po;
  uint local_114;
  char *pcStack_110;
  GLuint i_1;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  char *gs_codes_specialized_raw [2];
  undefined1 local_c8 [8];
  string gs_codes_specialized [2];
  char *local_80;
  char *fs_code_specialized_raw;
  string fs_code_specialized;
  GLuint i;
  Functions *gl;
  bool local_31;
  bool result;
  char *pcStack_30;
  bool has_shader_compilation_failed;
  char *gs_triangle_strip;
  char *gs_line_strip;
  char *fs_code;
  GeometryShaderInsufficientEmittedVerticesTest *this_local;
  long lVar10;
  
  gs_line_strip =
       "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(1.0, 0.0, 0.0, 0.0);\n}\n"
  ;
  gs_triangle_strip =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                       in;\nlayout (line_strip, max_vertices = 2) out;\n\n${IN_PER_VERTEX_DECL}\nvoid main()\n{\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  pcStack_30 = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                           in;\nlayout (triangle_strip, max_vertices = 3) out;\n\n${IN_PER_VERTEX_DECL}\nvoid main()\n{\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  local_31 = true;
  bVar2 = true;
  auVar1 = ZEXT416(this->m_number_of_gs) * ZEXT816(4);
  uVar7 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  fs_code = (char *)this;
  pGVar8 = (GLuint *)operator_new__(uVar7);
  this->m_gs_ids = pGVar8;
  auVar1 = ZEXT416(this->m_number_of_gs) * ZEXT816(4);
  uVar7 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pGVar8 = (GLuint *)operator_new__(uVar7);
  this->m_po_ids = pGVar8;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0xdb2);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  for (fs_code_specialized.field_2._12_4_ = 0;
      (uint)fs_code_specialized.field_2._12_4_ < this->m_number_of_gs;
      fs_code_specialized.field_2._12_4_ = fs_code_specialized.field_2._12_4_ + 1) {
    GVar5 = (**(code **)(lVar10 + 0x3f0))(0x8dd9);
    this->m_gs_ids[(uint)fs_code_specialized.field_2._12_4_] = GVar5;
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdbb);
    GVar5 = (**(code **)(lVar10 + 0x3c8))();
    this->m_po_ids[(uint)fs_code_specialized.field_2._12_4_] = GVar5;
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdbe);
  }
  GVar5 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdc4);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&fs_code_specialized_raw,&this->super_TestCaseBase,1,&gs_line_strip);
  local_80 = (char *)std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)local_c8,&this->super_TestCaseBase,1,&gs_triangle_strip);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&gs_codes_specialized[0].field_2 + 8),&this->super_TestCaseBase,1,
             &stack0xffffffffffffffd0);
  vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&vs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_vs_code);
  pcStack_110 = (char *)std::__cxx11::string::c_str();
  local_114 = 0;
  do {
    if (this->m_number_of_gs <= local_114) {
LAB_01587bc0:
      if (bVar2) {
        (**(code **)(lVar10 + 0x6f8))(1,&this->m_texture_id);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glGenTextures() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xde5);
        (**(code **)(lVar10 + 0xb8))(0xde1,this->m_texture_id);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xde8);
        (**(code **)(lVar10 + 0x1380))(0xde1,1,0x8058,0x10);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glTexStorage2D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xdec);
        (**(code **)(lVar10 + 0x6d0))(1,&this->m_fbo_id);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glGenFramebuffers() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xdf0);
        (**(code **)(lVar10 + 0x78))(0x8d40,this->m_fbo_id);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glBindFramebuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xdf3);
        (**(code **)(lVar10 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texture_id,0);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glFramebufferTexture2D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xdf6);
        (**(code **)(lVar10 + 0x708))(1,&this->m_vao_id);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xdfa);
        (**(code **)(lVar10 + 0xd8))(this->m_vao_id);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xdfd);
        (**(code **)(lVar10 + 0x1c0))(0,0x3f800000,0);
        dVar6 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar6,"glClearColor() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xe00);
        for (local_29c = 0; local_29c < this->m_number_of_gs; local_29c = local_29c + 1) {
          (**(code **)(lVar10 + 0x1680))(this->m_po_ids[local_29c]);
          dVar6 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar6,"glUseProgram() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xe06);
          (**(code **)(lVar10 + 0x188))(0x4000);
          dVar6 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar6,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xe09);
          (**(code **)(lVar10 + 0x538))(0,0,1);
          dVar6 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar6,"glDrawArrays() call failed for GL_POINTS pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xe0c);
          (**(code **)(lVar10 + 0x1220))
                    (0,0,this->m_texture_width,this->m_texture_height,0x1908,0x1401,this->m_pixels);
          dVar6 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar6,"glReadPixels() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xe0f);
          for (local_2a0 = 0;
              local_2a0 <
              this->m_texture_width * this->m_texture_height * this->m_number_of_color_components -
              this->m_number_of_color_components;
              local_2a0 = this->m_number_of_color_components + local_2a0) {
            if ((((this->m_pixels[local_2a0] != '\0') && (this->m_pixels[local_2a0 + 1] != 0xff)) &&
                (this->m_pixels[local_2a0 + 2] != '\0')) && (this->m_pixels[local_2a0 + 3] != '\0'))
            {
              bVar2 = false;
              pTVar11 = tcu::TestContext::getLog
                                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                   m_testCtx);
              tcu::TestLog::operator<<
                        (&local_420,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar12 = tcu::MessageBuilder::operator<<(&local_420,(char (*) [8])"Pixel [");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_2a0);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [16])"] has color = [");
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,this->m_pixels + local_2a0);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a3caab);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,this->m_pixels + (local_2a0 + 1));
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a3caab);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,this->m_pixels + (local_2a0 + 2));
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a3caab);
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,this->m_pixels + (local_2a0 + 3));
              pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a0e7f2);
              pMVar12 = tcu::MessageBuilder::operator<<
                                  (pMVar12,(char (*) [27])"instead of [0, 255, 0, 0].");
              tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_420);
              break;
            }
          }
        }
      }
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      this_local._4_4_ = STOP;
      std::__cxx11::string::~string((string *)&vs_code_specialized_raw);
      local_528 = (string *)(gs_codes_specialized[1].field_2._M_local_buf + 8);
      do {
        local_528 = local_528 + -0x20;
        std::__cxx11::string::~string(local_528);
      } while (local_528 != (string *)local_c8);
      std::__cxx11::string::~string((string *)&fs_code_specialized_raw);
      return this_local._4_4_;
    }
    uVar7 = (ulong)local_114;
    bVar3 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_ids[uVar7],this->m_fs_id,1,&local_80,
                       this->m_gs_ids[uVar7],1,gs_codes_specialized_raw + (uVar7 - 1),this->m_vs_id,
                       1,&stack0xfffffffffffffef0,&local_31);
    if (!bVar3) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&pixel,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&pixel,
                           (char (*) [39])"Program object linking failed for i = ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2c316fc);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_114);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2aea36f);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&pixel);
      bVar2 = false;
      goto LAB_01587bc0;
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderInsufficientEmittedVerticesTest::iterate()
{
	/* Define Fragment Shader for purpose of this test. */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1.0, 0.0, 0.0, 0.0);\n"
						  "}\n";

	/* Define 2 Geometry Shaders for purpose of this test. */
	const char* gs_line_strip = "${VERSION}\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"layout (points)                       in;\n"
								"layout (line_strip, max_vertices = 2) out;\n"
								"\n"
								"${IN_PER_VERTEX_DECL}"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position    = gl_in[0].gl_Position;\n"
								"    gl_Position.zw = vec2(0.0, 1.0);\n"
								"    EmitVertex();\n"
								"}\n";

	const char* gs_triangle_strip = "${VERSION}\n"
									"${GEOMETRY_SHADER_REQUIRE}\n"
									"\n"
									"layout (points)                           in;\n"
									"layout (triangle_strip, max_vertices = 3) out;\n"
									"\n"
									"${IN_PER_VERTEX_DECL}"
									"\n"
									"void main()\n"
									"{\n"
									"    gl_Position    = gl_in[0].gl_Position;\n"
									"    gl_Position.zw = vec2(0.0, 1.0);\n"
									"    EmitVertex();\n"

									"    gl_Position    = gl_in[0].gl_Position;\n"
									"    gl_Position.zw = vec2(0.0, 1.0);\n"
									"    EmitVertex();\n"
									"}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	m_gs_ids = new glw::GLuint[m_number_of_gs];
	m_po_ids = new glw::GLuint[m_number_of_gs];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects & geometry shader objects. */
	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		m_gs_ids[i] = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		m_po_ids[i] = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");
	}

	/* Create shader object. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_codes_specialized[] = { specializeShader(1, &gs_line_strip),
										   specializeShader(1, &gs_triangle_strip) };

	const char* gs_codes_specialized_raw[] = { gs_codes_specialized[0].c_str(), gs_codes_specialized[1].c_str() };

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		if (!TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,				  /* n_sh1_body_parts */
										&fs_code_specialized_raw, m_gs_ids[i], 1, /* n_sh2_body_parts */
										&gs_codes_specialized_raw[i], m_vs_id, 1, /* n_sh3_body_parts */
										&vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed for i = "
							   << "[" << i << "]." << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	if (result)
	{
		/* Create a 2D texture. */
		gl.genTextures(1, &m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1 /*levels*/, GL_RGBA8, 16 /*width taken from spec*/,
						16 /*height taken from spec*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

		/* Configure FBO. */
		gl.genFramebuffers(1, &m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /*level*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Configure VAO. */
		gl.genVertexArrays(1, &m_vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

		gl.bindVertexArray(m_vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

		gl.clearColor(0.0f, 1.0f, 0.0f, 0.0f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

		for (glw::GLuint po = 0; po < m_number_of_gs; ++po)
		{
			/* Use Program Object. */
			gl.useProgram(m_po_ids[po]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			gl.drawArrays(GL_POINTS, 0 /*first*/, 1 /*count*/);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

			gl.readPixels(0 /*x*/, 0 /*y*/, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, m_pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

			for (glw::GLuint pixel = 0; pixel < (m_texture_width * m_texture_height * m_number_of_color_components -
												 m_number_of_color_components);
				 pixel += m_number_of_color_components)
			{
				if (m_pixels[pixel] != 0 && m_pixels[pixel + 1] != 255 && m_pixels[pixel + 2] != 0 &&
					m_pixels[pixel + 3] != 0)
				{
					result = false;

					m_testCtx.getLog() << tcu::TestLog::Message << "Pixel [" << pixel << "] has color = ["
									   << m_pixels[pixel] << ", " << m_pixels[pixel + 1] << ", " << m_pixels[pixel + 2]
									   << ", " << m_pixels[pixel + 3] << "] "
									   << "instead of [0, 255, 0, 0]." << tcu::TestLog::EndMessage;

					break;
				}
			}
		}
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}